

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O2

bool __thiscall wasm::EffectAnalyzer::invalidates(EffectAnalyzer *this,EffectAnalyzer *other)

{
  bool bVar1;
  size_type sVar2;
  _Base_ptr p_Var3;
  size_type sVar4;
  byte bVar5;
  byte bVar6;
  bool bVar7;
  undefined1 auStack_48 [8];
  uint local;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *local_38;
  
  bVar1 = transfersControlFlow(this);
  if ((bVar1) && (bVar1 = hasSideEffects(other), bVar1)) {
    return true;
  }
  bVar1 = transfersControlFlow(other);
  if ((bVar1) && (bVar1 = hasSideEffects(this), bVar1)) {
    return true;
  }
  bVar1 = this->writesMemory;
  if ((bVar1 == false) && (this->calls == false)) {
    bVar5 = other->writesMemory;
  }
  else {
    if (other->calls != false) {
      return true;
    }
    if (other->readsMemory != false) {
      return true;
    }
    bVar5 = other->writesMemory;
    if ((bool)bVar5 != false) {
      return true;
    }
  }
  if ((((bVar5 & 1) == 0) && (other->calls != true)) ||
     ((bVar7 = true, this->calls == false && (((this->readsMemory | bVar1) & 1U) == 0)))) {
    if ((this->writesTable == false) && (this->calls == false)) {
      bVar6 = other->writesTable;
    }
    else {
      if (other->calls != false) {
        return true;
      }
      if (other->readsTable != false) {
        return true;
      }
      bVar6 = other->writesTable;
      if ((bool)bVar6 != false) {
        return true;
      }
    }
    if ((((bVar6 & 1) == 0) && (other->calls != true)) ||
       ((bVar7 = true, this->calls == false && (((this->writesTable | this->readsTable) & 1U) == 0))
       )) {
      if ((this->writesStruct == false) && (this->calls == false)) {
        bVar6 = other->writesStruct;
      }
      else {
        if (other->calls != false) {
          return true;
        }
        if (other->readsMutableStruct != false) {
          return true;
        }
        bVar6 = other->writesStruct;
        if ((bool)bVar6 != false) {
          return true;
        }
      }
      if ((((bVar6 & 1) == 0) && (other->calls != true)) ||
         ((bVar7 = true, this->calls == false &&
          (((this->writesStruct | this->readsMutableStruct) & 1U) == 0)))) {
        if ((this->writesArray == false) && (this->calls == false)) {
          bVar6 = other->writesArray;
        }
        else {
          if (other->calls != false) {
            return true;
          }
          if (other->readsArray != false) {
            return true;
          }
          bVar6 = other->writesArray;
          if ((bool)bVar6 != false) {
            return true;
          }
        }
        if (((((((bVar6 & 1) == 0) && (other->calls != true)) ||
              ((bVar7 = true, this->calls == false &&
               (((this->writesArray | this->readsArray) & 1U) == 0)))) &&
             ((bVar7 = true, this->danglingPop == false && (other->danglingPop == false)))) &&
            ((this->isAtomic != true ||
             ((other->calls == false && (((bVar5 | other->readsMemory) & 1) == 0)))))) &&
           ((other->isAtomic != true ||
            ((this->calls == false && (((bVar1 | this->readsMemory) & 1U) == 0)))))) {
          local_38 = &other->localsWritten;
          for (p_Var3 = (this->localsWritten)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var3 != &(this->localsWritten)._M_t._M_impl.super__Rb_tree_header
              ; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
            auStack_48._0_4_ = p_Var3[1]._M_color;
            sVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                    count(&other->localsRead,(key_type *)auStack_48);
            if (sVar2 != 0) {
              return true;
            }
            sVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                    count(local_38,(key_type *)auStack_48);
            if (sVar2 != 0) {
              return true;
            }
          }
          for (p_Var3 = (this->localsRead)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var3 != &(this->localsRead)._M_t._M_impl.super__Rb_tree_header;
              p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
            auStack_48._0_4_ = p_Var3[1]._M_color;
            sVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                    count(local_38,(key_type *)auStack_48);
            if (sVar2 != 0) {
              return true;
            }
          }
          if (((other->calls != true) ||
              ((this->globalsWritten)._M_t._M_impl.super__Rb_tree_header._M_node_count +
               (this->mutableGlobalsRead)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) &&
             ((this->calls != true ||
              ((other->globalsWritten)._M_t._M_impl.super__Rb_tree_header._M_node_count +
               (other->mutableGlobalsRead)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0))))
          {
            local_38 = (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       &other->globalsWritten;
            for (p_Var3 = (this->globalsWritten)._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_left;
                (_Rb_tree_header *)p_Var3 !=
                &(this->globalsWritten)._M_t._M_impl.super__Rb_tree_header;
                p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
              auStack_48 = *(undefined1 (*) [8])(p_Var3 + 1);
              _local = p_Var3[1]._M_parent;
              sVar4 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::
                      count(&other->mutableGlobalsRead,(key_type *)auStack_48);
              if (sVar4 != 0) {
                return true;
              }
              sVar4 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::
                      count((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                            local_38,(key_type *)auStack_48);
              if (sVar4 != 0) {
                return true;
              }
            }
            for (p_Var3 = (this->mutableGlobalsRead)._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_left;
                (_Rb_tree_header *)p_Var3 !=
                &(this->mutableGlobalsRead)._M_t._M_impl.super__Rb_tree_header;
                p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
              auStack_48 = *(undefined1 (*) [8])(p_Var3 + 1);
              _local = p_Var3[1]._M_parent;
              sVar4 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::
                      count((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                            local_38,(key_type *)auStack_48);
              if (sVar4 != 0) {
                return true;
              }
            }
            if (((this->trap == true) &&
                ((other->throws_ != false ||
                 ((other->delegateTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0))))
               || ((((this->delegateTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0 |
                    this->throws_) == 1 && ((other->trap & 1U) != 0)))) {
              __assert_fail("!((trap && other.throws()) || (throws() && other.trap))",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/effects.h"
                            ,0x14b,"bool wasm::EffectAnalyzer::invalidates(const EffectAnalyzer &)")
              ;
            }
            if ((((this->trapsNeverHappen == true) && (bVar1 = transfersControlFlow(this), !bVar1))
                && (bVar1 = transfersControlFlow(other), !bVar1)) ||
               (((this->trap != true || (bVar1 = writesGlobalState(other), !bVar1)) &&
                ((other->trap != true || (bVar1 = writesGlobalState(this), !bVar1)))))) {
              bVar7 = false;
            }
          }
        }
      }
    }
  }
  return bVar7;
}

Assistant:

bool invalidates(const EffectAnalyzer& other) {
    if ((transfersControlFlow() && other.hasSideEffects()) ||
        (other.transfersControlFlow() && hasSideEffects()) ||
        ((writesMemory || calls) && other.accessesMemory()) ||
        ((other.writesMemory || other.calls) && accessesMemory()) ||
        ((writesTable || calls) && other.accessesTable()) ||
        ((other.writesTable || other.calls) && accessesTable()) ||
        ((writesStruct || calls) && other.accessesMutableStruct()) ||
        ((other.writesStruct || other.calls) && accessesMutableStruct()) ||
        ((writesArray || calls) && other.accessesArray()) ||
        ((other.writesArray || other.calls) && accessesArray()) ||
        (danglingPop || other.danglingPop)) {
      return true;
    }
    // All atomics are sequentially consistent for now, and ordered wrt other
    // memory references.
    if ((isAtomic && other.accessesMemory()) ||
        (other.isAtomic && accessesMemory())) {
      return true;
    }
    for (auto local : localsWritten) {
      if (other.localsRead.count(local) || other.localsWritten.count(local)) {
        return true;
      }
    }
    for (auto local : localsRead) {
      if (other.localsWritten.count(local)) {
        return true;
      }
    }
    if ((other.calls && accessesMutableGlobal()) ||
        (calls && other.accessesMutableGlobal())) {
      return true;
    }
    for (auto global : globalsWritten) {
      if (other.mutableGlobalsRead.count(global) ||
          other.globalsWritten.count(global)) {
        return true;
      }
    }
    for (auto global : mutableGlobalsRead) {
      if (other.globalsWritten.count(global)) {
        return true;
      }
    }
    // Note that the above includes disallowing the reordering of a trap with an
    // exception (as an exception can transfer control flow inside the current
    // function, so transfersControlFlow would be true) - while we allow the
    // reordering of traps with each other, we do not reorder exceptions with
    // anything.
    assert(!((trap && other.throws()) || (throws() && other.trap)));
    // We can't reorder an implicit trap in a way that could alter what global
    // state is modified. However, in trapsNeverHappen mode we assume traps do
    // not occur in practice, which lets us ignore this, at least in the case
    // that the code executes. As mentioned above, we assume that there is no
    // transfer of control flow between the things we are comparing, so all we
    // need to do is check for such transfers in them.
    if (!trapsNeverHappen || transfersControlFlow() ||
        other.transfersControlFlow()) {
      if ((trap && other.writesGlobalState()) ||
          (other.trap && writesGlobalState())) {
        return true;
      }
    }
    return false;
  }